

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

int mpt_init(int argc,char **argv)

{
  byte bVar1;
  mpt_metatype *pmVar2;
  uint uVar3;
  mpt_config *cfg_00;
  int iVar4;
  char *pcVar5;
  mpt_logger *log;
  byte *pbVar6;
  FILE *pFVar7;
  size_t sVar8;
  void *pvVar9;
  mpt_type_traits *pmVar10;
  mpt_metatype *pmVar11;
  mpt_node *node;
  int iVar12;
  size_t len;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  byte *pbVar17;
  char **ppcVar18;
  bool bVar19;
  char *local_c0;
  int dbg;
  undefined4 uStack_b4;
  FILE *pFStack_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  char **local_98;
  mpt_config *cfg;
  mpt_node *local_88;
  uint8_t local_80 [4];
  ulong local_78;
  char *local_70;
  mpt_metatype *local_68;
  void *local_60;
  mpt_path p;
  
  p.len = 0;
  p.first = '\0';
  p.flags = '\0';
  p.sep = '.';
  p.assign = '\0';
  p._28_4_ = 0;
  p.base = (char *)0x0;
  p.off = 0;
  local_98 = argv;
  pcVar5 = getenv("MPT_DEBUG");
  if (pcVar5 != (char *)0x0) {
    dbg = 1;
    iVar4 = mpt_cint(&dbg,pcVar5,0,(int *)0x0);
    if (iVar4 < 0) {
      dbg = 1;
      iVar4 = 1;
    }
    else {
      iVar4 = dbg;
      if (0xe < dbg) {
        dbg = 0xf;
        iVar4 = 0xf;
      }
    }
    if (setDebug_old < iVar4) {
      iVar14 = 0x10;
      if (iVar4 * 4 < 0x10) {
        iVar14 = iVar4 * 4;
      }
      setDebug_old = iVar4;
      mpt_log_default_skip(iVar14 + 0x10);
    }
  }
  mpt_path_set(&p,"mpt",-1);
  local_68 = mpt_config_global(&p);
  if (local_68 == (mpt_metatype *)0x0) {
    return -4;
  }
  (*(local_68->_vptr->convertable).convert)((mpt_convertable *)local_68,0x85,&cfg);
  cfg_00 = cfg;
  pcVar5 = getenv("MPT_PREFIX_ETC");
  log = mpt_log_default();
  mpt_config_load(cfg_00,pcVar5,log);
  pbVar6 = (byte *)getenv("MPT_FLAGS");
  if (pbVar6 != (byte *)0x0) {
    iVar14 = 0;
    iVar4 = 0;
LAB_0011db8d:
    while( true ) {
      iVar12 = iVar4;
      pbVar17 = pbVar6 + 1;
      bVar1 = *pbVar6;
      pbVar6 = pbVar17;
      iVar4 = iVar12;
      if (bVar1 < 0x65) break;
      if (bVar1 == 0x65) {
        iVar12 = iVar14 + 1;
        bVar19 = iVar14 == 0;
        iVar14 = iVar12;
        if ((bVar19) && (setEnviron_global == '\0')) {
          mpt_config_environ((mpt_config *)0x0,"mpt_*",0x5f,(char **)0x0);
        }
      }
      else if (bVar1 == 0x76) {
        iVar4 = iVar12 + 1;
        if (setDebug_old < iVar12) {
          iVar13 = iVar12 * 4;
          if (0xf < iVar13) {
            iVar13 = 0x10;
          }
          setDebug_old = iVar12;
          mpt_log_default_skip(iVar13 + 0x10);
        }
      }
      else {
LAB_0011dbf6:
        mpt_log((mpt_logger *)0x0,"mpt_init",0x10,"%s, %c","unknown operation flag",
                (ulong)(uint)(int)(char)bVar1);
      }
    }
    if (bVar1 == 0x45) {
      if (iVar14 != 0) {
        mpt_log((mpt_logger *)0x0,"mpt_init",4,"%s");
      }
      if (setEnviron_global == '\0') {
        setEnviron_global = '\x01';
        mpt_config_environ((mpt_config *)0x0,(char *)0x0,0x5f,(char **)0x0);
      }
      goto LAB_0011db8d;
    }
    if (bVar1 != 0) goto LAB_0011dbf6;
  }
  uVar15 = 0;
  mpt_config_set(cfg,(char *)0x0,*local_98,0,0);
  if ((int)_optind < argc) {
    local_78 = 0;
    local_c0 = (char *)0x0;
    local_70 = (char *)0x0;
    do {
      iVar4 = __posix_getopt(argc,local_98,"+f:c:l:Ee:v");
      pcVar5 = _optarg;
      uVar3 = _optind;
      uVar15 = 0xffffffff;
      if (iVar4 < 99) {
        if (iVar4 == 0x45) {
          uVar15 = 0x45;
          if (setEnviron_global == '\0') {
            setEnviron_global = '\x01';
            pcVar5 = (char *)0x0;
LAB_0011dd6a:
            mpt_config_environ((mpt_config *)0x0,pcVar5,0x5f,(char **)0x0);
          }
          goto LAB_0011de61;
        }
        uVar15 = 0xffffffff;
        if (iVar4 == -1) {
          lVar16 = (long)(int)_optind;
          _dbg = (code *)0x0;
          local_88 = (mpt_node *)0x0;
          (*(local_68->_vptr->convertable).convert)((mpt_convertable *)local_68,9,&local_88);
          if (local_88 != (mpt_node *)0x0) {
            ppcVar18 = local_98 + lVar16;
            iVar4 = argc - uVar3;
            goto LAB_0011df92;
          }
          uVar15 = 0xfffffffd;
        }
        break;
      }
      switch(iVar4) {
      case 99:
        uVar15 = 0xffffffff;
        if (local_c0 == (char *)0x0) {
          pcVar5 = "connect";
          local_c0 = _optarg;
          goto LAB_0011df1a;
        }
      case 100:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
        goto switchD_0011dd14_caseD_64;
      case 0x65:
        uVar15 = 0x65;
        if (setEnviron_global == '\0') {
          if (_optarg == (char *)0x0) {
            setEnviron_global = '\x01';
          }
          goto LAB_0011dd6a;
        }
        break;
      case 0x66:
        local_60 = (void *)0x0;
        local_a8 = 1;
        uStack_a0._0_2_ = 0xff;
        uStack_a0._2_2_ = 0xff;
        uStack_a0._4_2_ = 0;
        uStack_a0._6_1_ = '\0';
        uStack_a0._7_1_ = '\0';
        _dbg = (code *)0x0;
        pFStack_b0 = (FILE *)0x0;
        local_88 = (mpt_node *)0x2722003d007d7b;
        local_80[0] = '#';
        local_80[1] = '\0';
        local_80[2] = '\0';
        local_80[3] = '\0';
        pmVar11 = mpt_config_global((mpt_path *)0x0);
        (*(pmVar11->_vptr->convertable).convert)((mpt_convertable *)pmVar11,0x85,&local_60);
        pFVar7 = fopen(pcVar5,"r");
        if (pFVar7 == (FILE *)0x0) {
          mpt_log((mpt_logger *)0x0,"mpt_init::config",3,"%s: %s","failed to open config file",
                  pcVar5);
          goto LAB_0011e041;
        }
        pFStack_b0 = fopen(pcVar5,"r");
        if (pFStack_b0 == (FILE *)0x0) {
          uVar15 = 0;
        }
        else {
          mpt_parse_format((mpt_parser_format *)&local_88,(char *)0x0);
          _dbg = mpt_getchar_stdio;
          local_a8 = 1;
          uVar15 = mpt_parse_config(mpt_parse_format_pre,(mpt_parser_format *)&local_88,
                                    (mpt_parser_context *)&dbg,saveGlobal,local_60);
          fclose(pFStack_b0);
          if ((int)uVar15 < 0) {
            mpt_log((mpt_logger *)0x0,"mpt_init::config",3,"%s %d (line %d): %s","parse error",
                    (ulong)uVar15,local_a8 & 0xffffffff,pcVar5);
            goto LAB_0011e041;
          }
        }
        break;
      case 0x6c:
        uVar15 = 0xffffffff;
        if (local_70 != (char *)0x0) goto switchD_0011dd14_caseD_64;
        pcVar5 = "listen";
        local_70 = _optarg;
LAB_0011df1a:
        uVar15 = mpt_config_set(cfg,pcVar5,_optarg,0,0);
        if ((int)uVar15 < 0) goto switchD_0011dd14_caseD_64;
        break;
      default:
        uVar15 = 0xffffffff;
        if (iVar4 != 0x76) goto switchD_0011dd14_caseD_64;
        iVar4 = (int)local_78;
        if (setDebug_old < iVar4) {
          iVar14 = iVar4 * 4;
          if (0xf < iVar14) {
            iVar14 = 0x10;
          }
          setDebug_old = iVar4;
          mpt_log_default_skip(iVar14 + 0x10);
        }
        local_78 = (ulong)(iVar4 + 1);
        uVar15 = 0x76;
      }
LAB_0011de61:
    } while ((int)_optind < argc);
  }
  goto switchD_0011dd14_caseD_64;
  while( true ) {
    pcVar5 = *ppcVar18;
    if (pcVar5 == (char *)0x0) {
      len = 1;
      pcVar5 = (char *)0x0;
    }
    else {
      sVar8 = strlen(pcVar5);
      len = sVar8 + 1;
    }
    pvVar9 = mpt_array_append((mpt_array *)&dbg,len,pcVar5);
    ppcVar18 = ppcVar18 + 1;
    iVar4 = iVar4 + -1;
    if (pvVar9 == (void *)0x0) break;
LAB_0011df92:
    if (iVar4 < 1) {
      pmVar10 = mpt_type_traits(99);
      ((mpt_buffer *)_dbg)->_content_traits = pmVar10;
      pmVar11 = mpt_meta_buffer((mpt_array *)&dbg);
      mpt_array_clone((mpt_array *)&dbg,(mpt_array *)0x0);
      if (pmVar11 == (mpt_metatype *)0x0) goto LAB_0011e0b5;
      node = mpt_node_find(local_88,"args",-1);
      if (node == (mpt_node *)0x0) {
        node = mpt_node_new(5);
        if (node == (mpt_node *)0x0) {
          (*pmVar11->_vptr->unref)(pmVar11);
LAB_0011e041:
          uVar15 = 0xffffffff;
          goto switchD_0011dd14_caseD_64;
        }
        mpt_identifier_set(&node->ident,"args",-1);
        mpt_node_insert(local_88,1,node);
      }
      else {
        pmVar2 = node->_meta;
        if (pmVar2 != (mpt_metatype *)0x0) {
          (*pmVar2->_vptr->unref)(pmVar2);
        }
      }
      node->_meta = pmVar11;
      uVar15 = 0;
      goto switchD_0011dd14_caseD_64;
    }
  }
  mpt_array_clone((mpt_array *)&dbg,(mpt_array *)0x0);
LAB_0011e0b5:
  uVar15 = 0xfffffffc;
switchD_0011dd14_caseD_64:
  (*local_68->_vptr->unref)(local_68);
  atexit(clearConfig);
  if (-1 < (int)uVar15) {
    uVar15 = _optind;
  }
  return uVar15;
}

Assistant:

extern int mpt_init(int argc, char * const argv[])
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	MPT_INTERFACE(metatype) *top;
	MPT_INTERFACE(config) *cfg;
	const char *ctl = 0, *src = 0, *debug, *flags;
	int lv = 0, ret;
	
	if ((debug = getenv("MPT_DEBUG"))) {
		int dbg = 1;
		if (mpt_cint(&dbg, debug, 0, 0) < 0) {
			dbg = 1;
		}
		else if (dbg > 0xe) {
			dbg = 0xf;
		}
		setDebug(dbg);
	}
	/* use global mpt config section */
	mpt_path_set(&p, "mpt", -1);
	if (!(top = mpt_config_global(&p))) {
		return MPT_ERROR(BadOperation);
	}
	MPT_metatype_convert(top, MPT_ENUM(TypeConfigPtr), &cfg);
	
	/* load configs in `etc` subdirectory */
	mpt_config_load(cfg, getenv("MPT_PREFIX_ETC"), mpt_log_default());
	
	/* additional flags from enfironment */
	if ((flags = getenv("MPT_FLAGS"))) {
		int env = 0;
		char curr;
		while ((curr = *flags++)) {
			switch (curr) {
			  case 'v':
				setDebug(lv++);
				continue;
			  case 'E':
				/* global environment loading (masks granular) */
				if (env) {
					mpt_log(0, __func__, MPT_LOG(Warning), "%s",
					        MPT_tr("global environment load after specialized"));
				}
				setEnviron(0);
				continue;
			  case 'e':
				/* limited environment on first occurance only */
				if (!env++) {
					setEnviron("mpt_*");
				}
				continue;
			  default:
				mpt_log(0, __func__, MPT_LOG(Debug), "%s, %c",
				        MPT_tr("unknown operation flag"), curr);
			}
		}
	}
	/* set executable name */
	mpt_config_set(cfg, 0, argv[0], 0, 0);
	
	ret = 0;
	lv = 0; /* reset debug level */
	while (optind < argc) {
		switch (ret = getopt(argc, argv, "+f:c:l:Ee:v")) {
		    case -1:
			ret = saveArgs(top, argc - optind, argv + optind);
			break;
		    case 'f':
			if ((ret = loadConfig(0, optarg)) < 0) {
				break;
			}
			continue;
		    case 'c':
			if (ctl) {
				ret = MPT_ERROR(BadArgument);
				break;
			}
			ctl = optarg;
			if ((ret = mpt_config_set(cfg, "connect", ctl, 0, 0)) < 0) {
				break;
			}
			continue;
		    case 'l':
			if (src) {
				ret = MPT_ERROR(BadArgument);
				break;
			}
			src = optarg;
			if ((ret = mpt_config_set(cfg, "listen", src, 0, 0)) < 0) {
				break;
			}
			continue;
		    case 'v':
			setDebug(lv++);
			continue;
		    case 'E':
			setEnviron(0);
			continue;
		    case 'e':
			setEnviron(optarg);
			continue;
		    default:
			ret = MPT_ERROR(BadArgument);
		}
		break;
	}
	top->_vptr->unref(top);
	atexit(clearConfig);
	
	return ret < 0 ? ret : optind;
}